

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  int64_t iVar2;
  int64_t iVar3;
  JSShape *sh;
  JSValue new_target;
  JSValueUnion JVar4;
  JSValue JVar5;
  int iVar6;
  JSRefCountHeader *p_1;
  uint uVar7;
  int64_t iVar8;
  ulong uVar9;
  ulong uVar10;
  JSRefCountHeader *p_4;
  JSValueUnion JVar11;
  JSValueUnion JVar12;
  JSRefCountHeader *p;
  bool bVar13;
  JSValue enum_obj;
  JSValue enum_obj_00;
  JSValue v;
  JSValue v_00;
  JSValue func_obj;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValue JVar18;
  JSValue prop;
  JSValue method;
  JSValue this_obj;
  int done;
  int64_t len;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar20;
  BOOL *in_stack_fffffffffffffee0;
  BOOL *pdone;
  int64_t local_f8;
  JSValueUnion local_f0;
  JSValueUnion local_e0;
  void *local_d8;
  int local_cc;
  JSValueUnion local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  int64_t local_a0;
  JSValueUnion local_98;
  int64_t local_90;
  JSValueUnion local_88;
  int64_t local_80;
  JSValueUnion local_78;
  BOOL *pBStack_70;
  ulong local_68;
  undefined8 local_60;
  JSValueUnion local_50;
  ulong local_48;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  
  local_e0 = (JSValueUnion)this_val.tag;
  piVar1 = *(int **)&(argv->u).int32;
  iVar2 = argv->tag;
  JVar17 = *argv;
  JVar15 = *argv;
  JVar14 = *argv;
  uVar10 = 0;
  local_a8 = 0;
  local_a0 = 3;
  local_98.int32 = 0;
  local_80 = 3;
  local_90 = 3;
  local_b0 = 1;
  if (argc < 2) {
    JVar11.float64 = 0.0;
    local_b8 = 3;
    local_d8 = (void *)0x0;
    local_c8.float64 = 0.0;
LAB_0016c92a:
    uVar19 = 0;
    JVar14 = JS_GetPropertyInternal(ctx,JVar14,0xc6,JVar15,0);
    uVar7 = (uint)JVar14.tag;
    if (uVar7 == 3) {
      local_c0 = JVar11;
      JVar14 = JS_ToObject(ctx,JVar17);
      if ((int)JVar14.tag != 6) {
LAB_0016cb50:
        JVar5.tag = JVar14.tag;
        JVar5.u.ptr = local_f0.ptr;
        JVar12 = JVar14.u;
        iVar6 = js_get_length64(ctx,(int64_t *)&local_48,JVar14);
        if (-1 < iVar6) {
          bVar13 = (long)(int)local_48 == local_48;
          local_78.float64 = (double)(long)local_48;
          if (bVar13) {
            local_78.ptr = (void *)(local_48 & 0xffffffff);
          }
          pBStack_70 = (BOOL *)7;
          if (bVar13) {
            pBStack_70 = (BOOL *)0;
          }
          JVar15 = js_typed_array_create(ctx,this_val,1,(JSValue *)&local_78);
          JVar11 = JVar15.u;
          if ((uint)JVar15.tag != 6) {
            uVar9 = (ulong)JVar11.ptr >> 0x20;
            if ((long)local_48 < 1) goto LAB_0016cc2d;
            local_c8.ptr = (void *)((ulong)local_d8 & 0xffffffff | (long)local_c8.ptr << 0x20);
            local_c0.float64 = local_c0.float64 | uVar10;
            uVar10 = 0;
            do {
              JVar17 = JS_GetPropertyInt64(ctx,JVar14,uVar10);
              if ((uint)JVar17.tag == 6) goto LAB_0016cbe9;
              JVar18 = JVar17;
              if ((char)local_b0 == '\0') {
                local_68 = uVar10 & 0xffffffff;
                local_60 = 0;
                local_40 = 0;
                uStack_38 = 3;
                new_target.tag = 3;
                new_target.u.ptr = (void *)((ulong)uStack_3c << 0x20);
                func_obj.tag = local_b8;
                func_obj.u.ptr = local_c8.ptr;
                this_obj.tag = local_80;
                this_obj.u.ptr = local_c0.ptr;
                _local_78 = JVar17;
                JVar18 = JS_CallInternal(ctx,func_obj,this_obj,new_target,2,(JSValue *)&local_78,2);
                if ((0xfffffff4 < (uint)JVar17.tag) &&
                   (iVar6 = *JVar17.u.ptr, *(int *)JVar17.u.ptr = iVar6 + -1, iVar6 < 2)) {
                  __JS_FreeValueRT(ctx->rt,JVar17);
                }
                if ((int)JVar18.tag == 6) goto LAB_0016cbe9;
              }
              iVar6 = JS_SetPropertyInt64(ctx,JVar15,uVar10,JVar18);
              if (iVar6 < 0) goto LAB_0016cbe9;
              uVar10 = uVar10 + 1;
            } while (local_48 != uVar10);
            goto LAB_0016cc37;
          }
LAB_0016cbe9:
          local_e0 = JVar11;
          if ((uint)JVar15.tag < 0xfffffff5) goto LAB_0016cc22;
          iVar6 = *JVar11.ptr;
          *(int *)JVar11.ptr = iVar6 + -1;
          JVar5 = JVar14;
          if (iVar6 < 2) {
            __JS_FreeValueRT(ctx->rt,JVar15);
          }
        }
        local_f8 = JVar5.tag;
        JVar14.tag = local_f8;
        JVar14.u.float64 = JVar12.float64;
        local_f0 = JVar5.u;
LAB_0016cc1e:
        local_f8 = JVar14.tag;
        JVar12 = JVar14.u;
        JVar14.tag = local_f8;
        JVar14.u.ptr = local_f0.ptr;
        JVar11.float64 = 0.0;
        JVar15.tag = 6;
        JVar15.u.ptr = local_e0.ptr;
        uVar9 = 0;
        goto LAB_0016cc32;
      }
LAB_0016c9da:
      JVar15.tag = 6;
      JVar15.u.ptr = local_e0.ptr;
      JVar11.float64 = 0.0;
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)uVar7;
      if (uVar7 == 6) goto LAB_0016c954;
      local_c0 = JVar11;
      if ((0xfffffff4 < uVar7) &&
         (iVar6 = *JVar14.u.ptr, *(int *)JVar14.u.ptr = iVar6 + -1, iVar6 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar14);
      }
      sh = ctx->array_shape;
      (sh->header).ref_count = (sh->header).ref_count + 1;
      JVar14 = JS_NewObjectFromShape(ctx,sh,2);
      if ((int)JVar14.tag == 6) goto LAB_0016c9da;
      if (0xfffffff4 < (uint)iVar2) {
        *piVar1 = *piVar1 + 1;
      }
      local_a8 = SUB84(piVar1,0);
      uStack_a4 = (undefined4)((ulong)piVar1 >> 0x20);
      local_a0 = iVar2;
      iVar6 = js_for_of_start(ctx,(JSValue *)&local_98,0);
      iVar3 = local_90;
      iVar2 = local_a0;
      if (iVar6 != 0) goto LAB_0016cc1e;
      local_88._4_4_ = uStack_a4;
      local_88.int32 = local_a8;
      JVar17.u._4_4_ = uStack_a4;
      JVar17.u.int32 = local_a8;
      JVar17.tag = local_a0;
      local_50._4_4_ = local_98._4_4_;
      local_50.int32 = local_98.int32;
      JVar18.u._4_4_ = local_98._4_4_;
      JVar18.u.int32 = local_98.int32;
      JVar18.tag = local_90;
      JVar15 = JS_IteratorNext(ctx,JVar17,JVar18,(int)&local_cc,
                               (JSValue *)CONCAT44(in_stack_fffffffffffffedc,uVar19),
                               in_stack_fffffffffffffee0);
      if ((int)JVar15.tag != 6) {
        uVar9 = 0;
        do {
          local_f0 = JVar14.u;
          if (local_cc != 0) goto LAB_0016cb50;
          JVar11.float64 = (double)(long)uVar9;
          if (uVar9 >> 0x1f == 0) {
            iVar8 = 0;
            JVar11.ptr = (void *)(uVar9 & 0xffffffff);
          }
          else {
            iVar8 = 7;
          }
          pBStack_70 = (BOOL *)JVar15.tag;
          uVar19 = JVar15.u._0_4_;
          uVar20 = JVar15.u._4_4_;
          prop.tag = iVar8;
          prop.u.ptr = JVar11.ptr;
          pdone = pBStack_70;
          _local_78 = JVar15;
          iVar6 = JS_DefinePropertyValueValue(ctx,JVar14,prop,JVar15,0x4007);
          if (iVar6 < 0) break;
          uVar9 = uVar9 + 1;
          enum_obj.tag = iVar2;
          enum_obj.u.ptr = local_88.ptr;
          method.tag = iVar3;
          method.u.float64 = local_50.float64;
          JVar15 = JS_IteratorNext(ctx,enum_obj,method,(int)&local_cc,
                                   (JSValue *)CONCAT44(uVar20,uVar19),pdone);
        } while ((int)JVar15.tag != 6);
      }
      if ((int)iVar2 != 3) {
        enum_obj_00.tag = iVar2;
        enum_obj_00.u.ptr = local_88.ptr;
        JS_IteratorClose(ctx,enum_obj_00,1);
      }
LAB_0016cc22:
      JVar11.float64 = 0.0;
      uVar9 = 0;
      JVar15.tag = 6;
      JVar15.u.ptr = local_e0.ptr;
LAB_0016cc2d:
      local_f0 = JVar14.u;
      JVar12 = local_f0;
LAB_0016cc32:
      local_f8 = JVar14.tag;
      JVar14.tag = local_f8;
      JVar14.u.float64 = JVar12.float64;
    }
LAB_0016cc37:
    if ((0xfffffff4 < (uint)JVar14.tag) &&
       (iVar6 = *JVar14.u.ptr, *(int *)JVar14.u.ptr = iVar6 + -1, iVar6 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
  }
  else {
    local_d8 = argv[1].u.ptr;
    iVar3 = argv[1].tag;
    local_c8.ptr = local_d8 >> 0x20;
    if ((int)iVar3 == 3) {
      uVar10 = 0;
      JVar11.float64 = 0.0;
      local_b8 = iVar3;
      goto LAB_0016c92a;
    }
    iVar6 = check_function(ctx,argv[1]);
    if (iVar6 == 0) {
      if (argc == 2) {
        uVar10 = 0;
        JVar11.float64 = 0.0;
      }
      else {
        local_80 = argv[2].tag;
        JVar11.ptr = argv[2].u.ptr & 0xffffffff00000000;
        uVar10 = (ulong)argv[2].u.ptr & 0xffffffff;
      }
      local_b0 = 0;
      local_b8 = iVar3;
      goto LAB_0016c92a;
    }
    uVar9 = 6;
LAB_0016c954:
    JVar15.tag = uVar9;
    JVar15.u.ptr = local_e0.ptr;
    uVar9 = 0;
    JVar11.float64 = 0.0;
  }
  if (0xfffffff4 < (uint)local_a0) {
    JVar12._4_4_ = uStack_a4;
    JVar12.int32 = local_a8;
    iVar6 = *JVar12.ptr;
    *(int *)JVar12.ptr = iVar6 + -1;
    if (iVar6 < 2) {
      v.tag = local_a0;
      v.u.ptr = JVar12.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  if (0xfffffff4 < (uint)local_90) {
    JVar4._4_4_ = local_98._4_4_;
    JVar4.int32 = local_98.int32;
    iVar6 = *JVar4.ptr;
    *(int *)JVar4.ptr = iVar6 + -1;
    if (iVar6 < 2) {
      v_00.tag = local_90;
      v_00.u.ptr = JVar4.ptr;
      __JS_FreeValueRT(ctx->rt,v_00);
    }
  }
  JVar16.u.ptr = (void *)((ulong)JVar11.ptr & 0xffffffff | uVar9 << 0x20);
  JVar16.tag = JVar15.tag;
  return JVar16;
}

Assistant:

static JSValue js_typed_array_from(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, arr, r, v, v2;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arr = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        arr = JS_NewArray(ctx);
        if (JS_IsException(arr))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (JS_DefinePropertyValueInt64(ctx, arr, k, v, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arr = JS_ToObject(ctx, items);
        if (JS_IsException(arr))
            goto exception;
    }
    if (js_get_length64(ctx, &len, arr) < 0)
        goto exception;
    v = JS_NewInt64(ctx, len);
    args[0] = v;
    r = js_typed_array_create(ctx, this_val, 1, args);
    JS_FreeValue(ctx, v);
    if (JS_IsException(r))
        goto exception;
    for(k = 0; k < len; k++) {
        v = JS_GetPropertyInt64(ctx, arr, k);
        if (JS_IsException(v))
            goto exception;
        if (mapping) {
            args[0] = v;
            args[1] = JS_NewInt32(ctx, k);
            v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
            JS_FreeValue(ctx, v);
            v = v2;
            if (JS_IsException(v))
                goto exception;
        }
        if (JS_SetPropertyInt64(ctx, r, k, v) < 0)
            goto exception;
    }
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}